

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::AddTableFunctionOverloadInfo,duckdb::AlterEntryData,duckdb::TableFunctionSet_const&>
          (duckdb *this,AlterEntryData *args,TableFunctionSet *args_1)

{
  AddTableFunctionOverloadInfo *this_00;
  FunctionSet<duckdb::TableFunction> local_c0;
  AlterEntryData local_88;
  
  this_00 = (AddTableFunctionOverloadInfo *)operator_new(0xb0);
  AlterEntryData::AlterEntryData(&local_88,args);
  FunctionSet<duckdb::TableFunction>::FunctionSet
            (&local_c0,&args_1->super_FunctionSet<duckdb::TableFunction>);
  AddTableFunctionOverloadInfo::AddTableFunctionOverloadInfo
            (this_00,&local_88,(TableFunctionSet *)&local_c0);
  *(AddTableFunctionOverloadInfo **)this = this_00;
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_c0);
  AlterEntryData::~AlterEntryData(&local_88);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}